

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O3

uint32_t * unpack7_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint32_t uVar2;
  
  *out = (*in & 0x7f) + base;
  out[1] = (*in >> 7 & 0x7f) + base;
  out[2] = (*in >> 0xe & 0x7f) + base;
  out[3] = (*in >> 0x15 & 0x7f) + base;
  uVar1 = *in;
  out[4] = uVar1 >> 0x1c;
  out[4] = (uVar1 >> 0x1c) + base + (in[1] & 7) * 0x10;
  out[5] = (in[1] >> 3 & 0x7f) + base;
  out[6] = (in[1] >> 10 & 0x7f) + base;
  out[7] = (in[1] >> 0x11 & 0x7f) + base;
  out[8] = (*(byte *)((long)in + 7) & 0x7f) + base;
  uVar2 = in[1];
  out[9] = -((int)uVar2 >> 0x1f);
  out[9] = -((int)uVar2 >> 0x1f) + base + (in[2] & 0x3f) * 2;
  out[10] = (in[2] >> 6 & 0x7f) + base;
  out[0xb] = (in[2] >> 0xd & 0x7f) + base;
  out[0xc] = (in[2] >> 0x14 & 0x7f) + base;
  uVar1 = in[2];
  out[0xd] = uVar1 >> 0x1b;
  out[0xd] = (uVar1 >> 0x1b) + base + (in[3] & 3) * 0x20;
  out[0xe] = (in[3] >> 2 & 0x7f) + base;
  out[0xf] = (in[3] >> 9 & 0x7f) + base;
  return in + 4;
}

Assistant:

uint32_t * unpack7_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 7 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  7  )   % (1U << 7 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  14  )   % (1U << 7 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  21  )   % (1U << 7 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 3 ))<<( 7 - 3 );
    *out += base;
    out++;
    *out = ( (*in) >>  3  )   % (1U << 7 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  10  )   % (1U << 7 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  17  )   % (1U << 7 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  )   % (1U << 7 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  31  ) ;
    ++in;
    *out |= ((*in) % (1U<< 6 ))<<( 7 - 6 );
    *out += base;
    out++;
    *out = ( (*in) >>  6  )   % (1U << 7 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  13  )   % (1U << 7 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  20  )   % (1U << 7 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  27  ) ;
    ++in;
    *out |= ((*in) % (1U<< 2 ))<<( 7 - 2 );
    *out += base;
    out++;
    *out = ( (*in) >>  2  )   % (1U << 7 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  9  )   % (1U << 7 )  ;
    *out += base;
    out++;

    return in + 1;
}